

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssh2_agent_forwarding.c
# Opt level: O1

int main(int argc,char **argv)

{
  char *pcVar1;
  uint uVar2;
  in_addr_t iVar3;
  int iVar4;
  int iVar5;
  LIBSSH2_SESSION *session;
  long lVar6;
  long lVar7;
  size_t sVar8;
  ulong uVar9;
  char *pcVar10;
  fd_set *__readfds;
  LIBSSH2_SESSION *pLVar11;
  char *pcVar12;
  undefined8 uVar13;
  fd_set *__writefds;
  libssh2_agent_publickey *identity;
  char *exitsignal;
  sockaddr_in sin;
  char buffer [16384];
  timeval tStack_4120;
  fd_set fStack_4110;
  ulong uStack_4088;
  char *pcStack_4080;
  LIBSSH2_SESSION *pLStack_4078;
  code *pcStack_4070;
  ulong local_4068;
  long local_4060;
  char *local_4058;
  undefined8 local_4050;
  sockaddr local_4048;
  undefined1 local_4038 [16392];
  
  local_4058 = "none";
  if (argc < 2) {
    pcStack_4070 = (code *)0x1015f3;
    main_cold_15();
  }
  else {
    hostname = argv[1];
    username = argv[2];
    if (3 < argc) {
      commandline = argv[3];
    }
    pcStack_4070 = (code *)0x101622;
    uVar2 = libssh2_init(0);
    if (uVar2 == 0) {
      pcStack_4070 = (code *)0x101632;
      iVar3 = inet_addr(hostname);
      pcStack_4070 = (code *)0x101645;
      uVar2 = socket(2,1,0);
      if (uVar2 == 0xffffffff) {
        pcStack_4070 = (code *)0x101651;
        main_cold_13();
      }
      else {
        local_4048.sa_family = 2;
        local_4048.sa_data[0] = '\0';
        local_4048.sa_data[1] = '\x16';
        pcStack_4070 = (code *)0x10168e;
        local_4048.sa_data._2_4_ = iVar3;
        iVar4 = connect(uVar2,&local_4048,0x10);
        if (iVar4 == 0) {
          pcStack_4070 = (code *)0x10169f;
          session = (LIBSSH2_SESSION *)libssh2_session_init_ex(0,0,0,0);
          if (session == (LIBSSH2_SESSION *)0x0) {
            pcStack_4070 = (code *)0x1016a9;
            main_cold_12();
          }
          else {
            pcStack_4070 = (code *)0x1016e7;
            iVar4 = libssh2_session_handshake(session,uVar2);
            if (iVar4 == 0) {
              pcStack_4070 = (code *)0x1016f3;
              lVar6 = libssh2_agent_init(session);
              if (lVar6 == 0) {
                pcStack_4070 = (code *)0x1016fd;
                main_cold_11();
              }
              else {
                pcStack_4070 = (code *)0x101711;
                iVar4 = libssh2_agent_connect(lVar6);
                if (iVar4 == 0) {
                  pcStack_4070 = (code *)0x101721;
                  iVar4 = libssh2_agent_list_identities(lVar6);
                  if (iVar4 == 0) {
                    pcStack_4070 = (code *)0x101738;
                    iVar4 = libssh2_agent_get_identity(lVar6,&local_4060,0);
                    if (iVar4 != 1) {
                      pcVar12 = "Authentication with username %s and public key %s failed.\n";
                      do {
                        if (iVar4 < 0) {
                          pcStack_4070 = (code *)0x1017c4;
                          main_cold_9();
                          goto LAB_001016b3;
                        }
                        pcStack_4070 = (code *)0x101767;
                        iVar5 = libssh2_agent_userauth(lVar6,username,local_4060);
                        if (iVar5 == 0) {
                          pcStack_4070 = (code *)0x1017d7;
                          fprintf(_stderr,
                                  "Authentication with username %s and public key %s succeeded.\n",
                                  username,*(undefined8 *)(local_4060 + 0x20));
                          if (iVar4 == 0) {
                            pcStack_4070 = (code *)0x1017e9;
                            libssh2_session_set_blocking(session,0);
                            local_4068 = local_4068 & 0xffffffff00000000;
                            pcVar10 = "session";
                            pcStack_4070 = (code *)0x101812;
                            lVar7 = libssh2_channel_open_ex(session,"session",7,0x200000,0x8000,0);
                            if (lVar7 != 0) goto LAB_0010186c;
                            pcVar12 = "session";
                            goto LAB_0010181e;
                          }
                          break;
                        }
                        pcStack_4070 = (code *)0x10178f;
                        fprintf(_stderr,
                                "Authentication with username %s and public key %s failed.\n",
                                username,*(undefined8 *)(local_4060 + 0x20));
                        pcStack_4070 = (code *)0x10179f;
                        iVar4 = libssh2_agent_get_identity(lVar6,&local_4060,local_4060);
                      } while (iVar4 != 1);
                    }
                    pcStack_4070 = (code *)0x10188a;
                    main_cold_10();
                  }
                  else {
                    pcStack_4070 = (code *)0x1017ba;
                    main_cold_4();
                  }
                }
                else {
                  pcStack_4070 = (code *)0x1017b0;
                  main_cold_3();
                }
              }
            }
            else {
              pcStack_4070 = (code *)0x101704;
              main_cold_2();
            }
          }
        }
        else {
          pcStack_4070 = (code *)0x1016b0;
          main_cold_1();
        }
      }
      goto LAB_001016b3;
    }
    pcStack_4070 = (code *)0x10166d;
    fprintf(_stderr,"libssh2 initialization failed (%d)\n",(ulong)uVar2);
  }
  return 1;
  while( true ) {
    pcStack_4070 = (code *)0x10183f;
    waitsocket(uVar2,session);
    local_4068 = local_4068 & 0xffffffff00000000;
    pcVar10 = "session";
    pcStack_4070 = (code *)0x101864;
    lVar7 = libssh2_channel_open_ex(session,"session",7,0x200000,0x8000,0);
    if (lVar7 != 0) break;
LAB_0010181e:
    pcVar10 = (char *)0x0;
    pcStack_4070 = (code *)0x10182c;
    pLVar11 = session;
    iVar4 = libssh2_session_last_error(session,0,0,0);
    iVar5 = (int)pLVar11;
    if (iVar4 != -0x25) goto LAB_00101a0d;
  }
LAB_0010186c:
  while( true ) {
    lVar6 = lVar7;
    pcStack_4070 = (code *)0x101874;
    iVar5 = libssh2_channel_request_auth_agent(lVar6);
    if (iVar5 != -0x25) break;
    pcStack_4070 = (code *)0x101883;
    pcVar10 = (char *)session;
    waitsocket(uVar2,session);
    lVar7 = lVar6;
  }
  if (iVar5 == 0) {
    pcStack_4070 = (code *)0x1018b7;
    fwrite("Agent forwarding request succeeded.\n",0x24,1,_stdout);
    pcVar12 = "exec";
    while( true ) {
      pcVar1 = commandline;
      pcStack_4070 = (code *)0x1018cd;
      sVar8 = strlen(commandline);
      pcVar10 = "exec";
      pcStack_4070 = (code *)0x1018e3;
      lVar7 = lVar6;
      iVar4 = libssh2_channel_process_startup(lVar6,"exec",4,pcVar1,sVar8 & 0xffffffff);
      iVar5 = (int)lVar7;
      if (iVar4 != -0x25) break;
      pcStack_4070 = (code *)0x1018f2;
      waitsocket(uVar2,session);
    }
    if (iVar4 == 0) {
      uVar13 = 0;
      while( true ) {
        do {
          pcStack_4070 = (code *)0x101916;
          lVar7 = libssh2_channel_read_ex(lVar6,0,local_4038,0x4000);
          if (lVar7 < 1) {
            if (lVar7 != -0x25) {
              pcStack_4070 = (code *)0x101970;
              fprintf(_stderr,"libssh2_channel_read returned %ld\n",lVar7);
            }
          }
          else {
            pcStack_4070 = (code *)0x10194e;
            main_cold_6();
            uVar13 = local_4050;
          }
        } while (0 < lVar7);
        if (lVar7 != -0x25) break;
        pcStack_4070 = (code *)0x101939;
        waitsocket(uVar2,session);
      }
      while( true ) {
        pcStack_4070 = (code *)0x101984;
        iVar4 = libssh2_channel_close(lVar6);
        if (iVar4 != -0x25) break;
        pcStack_4070 = (code *)0x10197c;
        waitsocket(uVar2,session);
      }
      if (iVar4 == 0) {
        pcStack_4070 = (code *)0x101995;
        uVar2 = libssh2_channel_get_exit_status(lVar6);
        uVar9 = (ulong)uVar2;
        local_4068 = 0;
        pcStack_4070 = (code *)0x1019b6;
        libssh2_channel_get_exit_signal(lVar6,&local_4058,0,0,0,0);
      }
      else {
        uVar9 = 0x7f;
      }
      if (local_4058 == (char *)0x0) {
        pcStack_4070 = (code *)0x1019e4;
        fprintf(_stderr,"\nEXIT: %d bytecount: %ld\n",uVar9,uVar13);
      }
      else {
        pcStack_4070 = (code *)0x1019f4;
        fprintf(_stderr,"\nGot signal: %s\n");
      }
      pcStack_4070 = (code *)0x1019fc;
      libssh2_channel_free(lVar6);
LAB_001016b3:
      pcStack_4070 = (code *)0x1016c6;
      main_cold_14();
      return 0;
    }
  }
  else {
    pcStack_4070 = (code *)0x101a08;
    main_cold_8();
  }
  pcStack_4070 = (code *)0x101a0d;
  main_cold_7();
LAB_00101a0d:
  pcStack_4070 = waitsocket;
  main_cold_5();
  pcStack_4070 = (code *)lVar6;
  pLStack_4078 = session;
  pcStack_4080 = pcVar12;
  uStack_4088 = (ulong)uVar2;
  tStack_4120.tv_sec = 10;
  tStack_4120.tv_usec = 0;
  fStack_4110.fds_bits[0] = 0;
  fStack_4110.fds_bits[1] = 0;
  fStack_4110.fds_bits[2] = 0;
  fStack_4110.fds_bits[3] = 0;
  fStack_4110.fds_bits[4] = 0;
  fStack_4110.fds_bits[5] = 0;
  fStack_4110.fds_bits[6] = 0;
  fStack_4110.fds_bits[7] = 0;
  fStack_4110.fds_bits[8] = 0;
  fStack_4110.fds_bits[9] = 0;
  fStack_4110.fds_bits[10] = 0;
  fStack_4110.fds_bits[0xb] = 0;
  fStack_4110.fds_bits[0xc] = 0;
  fStack_4110.fds_bits[0xd] = 0;
  fStack_4110.fds_bits[0xe] = 0;
  fStack_4110.fds_bits[0xf] = 0;
  iVar4 = iVar5 + 0x3f;
  if (-1 < iVar5) {
    iVar4 = iVar5;
  }
  fStack_4110.fds_bits[iVar4 >> 6] =
       fStack_4110.fds_bits[iVar4 >> 6] | 1L << ((byte)(iVar5 % 0x40) & 0x3f);
  uVar9 = libssh2_session_block_directions(pcVar10);
  __readfds = &fStack_4110;
  if ((uVar9 & 1) == 0) {
    __readfds = (fd_set *)0x0;
  }
  __writefds = &fStack_4110;
  if ((uVar9 & 2) == 0) {
    __writefds = (fd_set *)0x0;
  }
  iVar4 = select(iVar5 + 1,__readfds,__writefds,(fd_set *)0x0,&tStack_4120);
  return iVar4;
}

Assistant:

int main(int argc, char *argv[])
{
    uint32_t hostaddr;
    libssh2_socket_t sock;
    struct sockaddr_in sin;
    int rc;
    LIBSSH2_SESSION *session = NULL;
    LIBSSH2_CHANNEL *channel;
    LIBSSH2_AGENT *agent = NULL;
    struct libssh2_agent_publickey *identity, *prev_identity = NULL;
    int exitcode;
    char *exitsignal = (char *)"none";
    ssize_t bytecount = 0;

#ifdef _WIN32
    WSADATA wsadata;

    rc = WSAStartup(MAKEWORD(2, 0), &wsadata);
    if(rc) {
        fprintf(stderr, "WSAStartup failed with error: %d\n", rc);
        return 1;
    }
#endif

    if(argc < 2) {
        fprintf(stderr, "At least IP and username arguments are required.\n");
        return 1;
    }
    /* must be ip address only */
    hostname = argv[1];
    username = argv[2];

    if(argc > 3) {
        commandline = argv[3];
    }

    rc = libssh2_init(0);
    if(rc) {
        fprintf(stderr, "libssh2 initialization failed (%d)\n", rc);
        return 1;
    }

    hostaddr = inet_addr(hostname);

    /* Ultra basic "connect to port 22 on localhost".  Your code is
     * responsible for creating the socket establishing the connection
     */
    sock = socket(AF_INET, SOCK_STREAM, 0);
    if(sock == LIBSSH2_INVALID_SOCKET) {
        fprintf(stderr, "failed to create socket.\n");
        goto shutdown;
    }

    sin.sin_family = AF_INET;
    sin.sin_port = htons(22);
    sin.sin_addr.s_addr = hostaddr;
    if(connect(sock, (struct sockaddr*)(&sin), sizeof(struct sockaddr_in))) {
        fprintf(stderr, "failed to connect.\n");
        goto shutdown;
    }

    /* Create a session instance */
    session = libssh2_session_init();
    if(!session) {
        fprintf(stderr, "Could not initialize SSH session.\n");
        goto shutdown;
    }

    if(libssh2_session_handshake(session, sock) != 0) {
        fprintf(stderr, "Failure establishing SSH session: %d\n", rc);
        goto shutdown;
    }

    /* Connect to the ssh-agent */
    agent = libssh2_agent_init(session);
    if(!agent) {
        fprintf(stderr, "Failure initializing ssh-agent support\n");
        rc = 1;
        goto shutdown;
    }
    if(libssh2_agent_connect(agent)) {
        fprintf(stderr, "Failure connecting to ssh-agent\n");
        rc = 1;
        goto shutdown;
    }
    if(libssh2_agent_list_identities(agent)) {
        fprintf(stderr, "Failure requesting identities to ssh-agent\n");
        rc = 1;
        goto shutdown;
    }
    for(;;) {
        rc = libssh2_agent_get_identity(agent, &identity, prev_identity);
        if(rc == 1)
            break;
        if(rc < 0) {
            fprintf(stderr,
                    "Failure obtaining identity from ssh-agent support\n");
            rc = 1;
            goto shutdown;
        }
        if(libssh2_agent_userauth(agent, username, identity)) {
            fprintf(stderr, "Authentication with username %s and "
                    "public key %s failed.\n",
                    username, identity->comment);
        }
        else {
            fprintf(stderr, "Authentication with username %s and "
                    "public key %s succeeded.\n",
                    username, identity->comment);
            break;
        }
        prev_identity = identity;
    }
    if(rc) {
        fprintf(stderr, "Could not continue authentication\n");
        goto shutdown;
    }

#if 0
    libssh2_trace(session, ~0);
#endif

    /* Set session to non-blocking */
    libssh2_session_set_blocking(session, 0);

    /* Exec non-blocking on the remote host */
    do {
        channel = libssh2_channel_open_session(session);
        if(channel ||
           libssh2_session_last_error(session, NULL, NULL, 0) !=
           LIBSSH2_ERROR_EAGAIN)
            break;
        waitsocket(sock, session);
    } while(1);
    if(!channel) {
        fprintf(stderr, "Error\n");
        exit(1);
    }
    while((rc = libssh2_channel_request_auth_agent(channel)) ==
          LIBSSH2_ERROR_EAGAIN) {
        waitsocket(sock, session);
    }
    if(rc) {
        fprintf(stderr, "Error, could not request auth agent, "
                "error code %d.\n", rc);
        exit(1);
    }
    else {
        fprintf(stdout, "Agent forwarding request succeeded.\n");
    }
    while((rc = libssh2_channel_exec(channel, commandline)) ==
          LIBSSH2_ERROR_EAGAIN) {
        waitsocket(sock, session);
    }
    if(rc) {
        fprintf(stderr, "Error\n");
        exit(1);
    }
    for(;;) {
        ssize_t nread;
        /* loop until we block */
        do {
            char buffer[0x4000];
            nread = libssh2_channel_read(channel, buffer, sizeof(buffer) );
            if(nread > 0) {
                ssize_t i;
                bytecount += nread;
                fprintf(stderr, "We read:\n");
                for(i = 0; i < nread; ++i)
                    fputc(buffer[i], stderr);
                fprintf(stderr, "\n");
            }
            else {
                if(nread != LIBSSH2_ERROR_EAGAIN)
                    /* no need to output this for the EAGAIN case */
                    fprintf(stderr, "libssh2_channel_read returned %ld\n",
                            (long)nread);
            }
        }
        while(nread > 0);

        /* this is due to blocking that would occur otherwise so we loop on
           this condition */
        if(nread == LIBSSH2_ERROR_EAGAIN) {
            waitsocket(sock, session);
        }
        else
            break;
    }
    exitcode = 127;
    while((rc = libssh2_channel_close(channel)) == LIBSSH2_ERROR_EAGAIN) {
        waitsocket(sock, session);
    }
    if(rc == 0) {
        exitcode = libssh2_channel_get_exit_status(channel);
        libssh2_channel_get_exit_signal(channel, &exitsignal,
                                        NULL, NULL, NULL, NULL, NULL);
    }

    if(exitsignal) {
        fprintf(stderr, "\nGot signal: %s\n", exitsignal);
    }
    else {
        fprintf(stderr, "\nEXIT: %d bytecount: %ld\n",
                exitcode, (long)bytecount);
    }

    libssh2_channel_free(channel);
    channel = NULL;

shutdown:

    if(session) {
        libssh2_session_disconnect(session, "Normal Shutdown");
        libssh2_session_free(session);
    }

    if(sock != LIBSSH2_INVALID_SOCKET) {
        shutdown(sock, 2);
        LIBSSH2_SOCKET_CLOSE(sock);
    }

    fprintf(stderr, "all done\n");

    libssh2_exit();

#ifdef _WIN32
    WSACleanup();
#endif

    return 0;
}